

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_symbol_codec.cpp
# Opt level: O0

uint __thiscall crnlib::symbol_codec::decode(symbol_codec *this,adaptive_huffman_data_model *model)

{
  long lVar1;
  byte *pbVar2;
  unsigned_short uVar3;
  uint uVar4;
  int iVar5;
  unsigned_short *puVar6;
  uint *in_RSI;
  adaptive_huffman_data_model *in_RDI;
  uint freq;
  int val_ptr;
  uint32 t;
  uint len;
  uint sym;
  uint k;
  uint c;
  decoder_tables *pTables;
  undefined4 in_stack_ffffffffffffffc0;
  uint local_30;
  uint local_2c;
  uint local_24;
  adaptive_huffman_data_model *this_00;
  
  lVar1 = *(long *)(in_RSI + 0x10);
  this_00 = in_RDI;
  while ((int)(in_RDI->m_code_sizes).m_capacity < 0x18) {
    local_24 = 0;
    if (*(unsigned_short **)&in_RDI->m_symbols_until_update == (in_RDI->m_sym_freq).m_p) {
      if (((ulong)(in_RDI->m_codes).m_p & 1) == 0) {
        (**(code **)&(in_RDI->m_codes).m_size)
                  (*(long *)&in_RDI->m_symbols_until_update - *(long *)in_RDI,
                   (in_RDI->m_code_sizes).m_p,in_RDI,&(in_RDI->m_sym_freq).m_size,&in_RDI->m_codes);
        (in_RDI->m_sym_freq).m_p =
             (unsigned_short *)(*(long *)in_RDI + *(long *)&(in_RDI->m_sym_freq).m_size);
        in_RDI->m_symbols_until_update = in_RDI->m_total_syms;
        in_RDI->m_total_count = in_RDI->m_update_cycle;
        if (*(unsigned_short **)&in_RDI->m_symbols_until_update < (in_RDI->m_sym_freq).m_p) {
          pbVar2 = *(byte **)&in_RDI->m_symbols_until_update;
          *(byte **)&in_RDI->m_symbols_until_update = pbVar2 + 1;
          local_24 = (uint)*pbVar2;
        }
      }
    }
    else {
      pbVar2 = *(byte **)&in_RDI->m_symbols_until_update;
      *(byte **)&in_RDI->m_symbols_until_update = pbVar2 + 1;
      local_24 = (uint)*pbVar2;
    }
    (in_RDI->m_code_sizes).m_capacity = (in_RDI->m_code_sizes).m_capacity + 8;
    (in_RDI->m_code_sizes).m_size =
         local_24 << (0x20U - (char)(in_RDI->m_code_sizes).m_capacity & 0x1f) |
         (in_RDI->m_code_sizes).m_size;
  }
  uVar4 = ((in_RDI->m_code_sizes).m_size >> 0x10) + 1;
  if (*(uint *)(lVar1 + 0x10) < uVar4) {
    local_30 = *(uint *)(lVar1 + 0x14);
    while (*(uint *)(lVar1 + 0x1c + (ulong)(local_30 - 1) * 4) < uVar4) {
      local_30 = local_30 + 1;
    }
    uVar4 = *(int *)(lVar1 + 0x60 + (ulong)(local_30 - 1) * 4) +
            ((in_RDI->m_code_sizes).m_size >> (0x20U - (char)local_30 & 0x1f));
    if (*in_RSI <= uVar4) {
      return 0;
    }
    local_2c = (uint)*(ushort *)(*(long *)(lVar1 + 0xb8) + (long)(int)uVar4 * 2);
  }
  else {
    local_30 = *(uint *)(*(long *)(lVar1 + 0xa8) +
                        (ulong)((in_RDI->m_code_sizes).m_size >>
                               (0x20U - (char)*(undefined4 *)(lVar1 + 8) & 0x1f)) * 4);
    local_2c = local_30 & 0xffff;
    local_30 = local_30 >> 0x10;
  }
  (in_RDI->m_code_sizes).m_size = (in_RDI->m_code_sizes).m_size << ((byte)local_30 & 0x1f);
  (in_RDI->m_code_sizes).m_capacity = (in_RDI->m_code_sizes).m_capacity - local_30;
  puVar6 = vector<unsigned_short>::operator[]((vector<unsigned_short> *)(in_RSI + 4),local_2c);
  iVar5 = *puVar6 + 1;
  uVar3 = (unsigned_short)iVar5;
  puVar6 = vector<unsigned_short>::operator[]((vector<unsigned_short> *)(in_RSI + 4),local_2c);
  *puVar6 = uVar3;
  if (iVar5 == 0xffff) {
    adaptive_huffman_data_model::rescale
              ((adaptive_huffman_data_model *)CONCAT44(0xffff,in_stack_ffffffffffffffc0));
  }
  uVar4 = in_RSI[2];
  in_RSI[2] = uVar4 - 1;
  if (uVar4 - 1 == 0) {
    *(int *)&in_RDI->m_pDecode_tables = *(int *)&in_RDI->m_pDecode_tables + 1;
    adaptive_huffman_data_model::update(this_00);
  }
  return local_2c;
}

Assistant:

uint symbol_codec::decode(adaptive_huffman_data_model& model) {
  CRNLIB_ASSERT(m_mode == cDecoding);
  CRNLIB_ASSERT(!model.m_encoding);

  const prefix_coding::decoder_tables* pTables = model.m_pDecode_tables;

  while (m_bit_count < (cBitBufSize - 8)) {
    uint c = 0;
    if (m_pDecode_buf_next == m_pDecode_buf_end) {
      if (!m_decode_buf_eof) {
        m_pDecode_need_bytes_func(m_pDecode_buf_next - m_pDecode_buf, m_pDecode_private_data, m_pDecode_buf, m_decode_buf_size, m_decode_buf_eof);
        m_pDecode_buf_end = m_pDecode_buf + m_decode_buf_size;
        m_pDecode_buf_next = m_pDecode_buf;
        if (m_pDecode_buf_next < m_pDecode_buf_end)
          c = *m_pDecode_buf_next++;
      }
    } else
      c = *m_pDecode_buf_next++;

    m_bit_count += 8;
    m_bit_buf |= (static_cast<bit_buf_t>(c) << (cBitBufSize - m_bit_count));
  }

  uint k = static_cast<uint>((m_bit_buf >> (cBitBufSize - 16)) + 1);
  uint sym, len;

  if (k <= pTables->m_table_max_code) {
    uint32 t = pTables->m_lookup[m_bit_buf >> (cBitBufSize - pTables->m_table_bits)];

    CRNLIB_ASSERT(t != cUINT32_MAX);
    sym = t & cUINT16_MAX;
    len = t >> 16;

    CRNLIB_ASSERT(model.m_code_sizes[sym] == len);
  } else {
    len = pTables->m_decode_start_code_size;

    for (;;) {
      if (k <= pTables->m_max_codes[len - 1])
        break;
      len++;
    }

    int val_ptr = pTables->m_val_ptrs[len - 1] + static_cast<int>((m_bit_buf >> (cBitBufSize - len)));

    if (((uint)val_ptr >= model.m_total_syms)) {
      // corrupted stream, or a bug
      CRNLIB_ASSERT(0);
      return 0;
    }

    sym = pTables->m_sorted_symbol_order[val_ptr];
  }

  m_bit_buf <<= len;
  m_bit_count -= len;

  uint freq = model.m_sym_freq[sym];
  freq++;
  model.m_sym_freq[sym] = static_cast<uint16>(freq);

  if (freq == cUINT16_MAX)
    model.rescale();

  if (--model.m_symbols_until_update == 0) {
    m_total_model_updates++;
    model.update();
  }

  return sym;
}